

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-data.hpp
# Opt level: O0

void __thiscall helics::Message::clear(Message *this)

{
  SmallBuffer *pSVar1;
  SmallBuffer *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  (in_RDI->buffer)._M_elems[0] = 0;
  (in_RDI->buffer)._M_elems[1] = 0;
  (in_RDI->buffer)._M_elems[2] = 0;
  (in_RDI->buffer)._M_elems[3] = 0;
  (in_RDI->buffer)._M_elems[4] = 0;
  (in_RDI->buffer)._M_elems[5] = 0;
  (in_RDI->buffer)._M_elems[6] = 0;
  (in_RDI->buffer)._M_elems[7] = 0;
  (in_RDI->buffer)._M_elems[8] = 0;
  (in_RDI->buffer)._M_elems[9] = 0;
  (in_RDI->buffer)._M_elems[0xc] = 0;
  (in_RDI->buffer)._M_elems[0xd] = 0;
  (in_RDI->buffer)._M_elems[0xe] = 0;
  (in_RDI->buffer)._M_elems[0xf] = 0;
  SmallBuffer::resize(in_RDI,in_stack_ffffffffffffffe8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e22e5);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e22f6);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e2307);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e2318);
  pSVar1 = in_RDI + 2;
  (pSVar1->buffer)._M_elems[0x30] = 0;
  (pSVar1->buffer)._M_elems[0x31] = 0;
  (pSVar1->buffer)._M_elems[0x32] = 0;
  (pSVar1->buffer)._M_elems[0x33] = 0;
  return;
}

Assistant:

void clear()
    {
        time = timeZero;
        flags = 0;
        messageID = 0;
        data.resize(0);
        dest.clear();
        source.clear();
        original_source.clear();
        original_dest.clear();
        counter = 0;
    }